

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void set_trap_graphic(wchar_t trap_idx,wchar_t light_idx,uint8_t attr,wchar_t ch)

{
  wchar_t ch_local;
  uint8_t attr_local;
  wchar_t light_idx_local;
  wchar_t trap_idx_local;
  
  if (light_idx < L'\x04') {
    trap_x_attr[light_idx][trap_idx] = attr;
    trap_x_char[light_idx][trap_idx] = ch;
  }
  else {
    for (ch_local = L'\0'; ch_local < L'\x04'; ch_local = ch_local + L'\x01') {
      trap_x_attr[ch_local][trap_idx] = attr;
      trap_x_char[ch_local][trap_idx] = ch;
    }
  }
  return;
}

Assistant:

static void set_trap_graphic(int trap_idx, int light_idx, uint8_t attr, wchar_t ch) {
	if (light_idx < LIGHTING_MAX) {
		trap_x_attr[light_idx][trap_idx] = attr;
		trap_x_char[light_idx][trap_idx] = ch;
	} else {
		for (light_idx = 0; light_idx < LIGHTING_MAX; light_idx++) {
			trap_x_attr[light_idx][trap_idx] = attr;
			trap_x_char[light_idx][trap_idx] = ch;
		}
	}
}